

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWSLoader.cpp
# Opt level: O1

void __thiscall Assimp::LWSImporter::ReadEnvelope(LWSImporter *this,Element *dad,Envelope *fill)

{
  pointer *ppKVar1;
  Assimp AVar2;
  _List_node_base *p_Var3;
  iterator __position;
  pointer pKVar4;
  bool bVar5;
  int iVar6;
  _List_node_base *p_Var7;
  Assimp *pAVar8;
  Logger *pLVar9;
  undefined1 check_comma;
  PrePostBehaviour PVar10;
  uint *puVar11;
  uint *puVar12;
  uint uVar13;
  ulong uVar14;
  Assimp *pAVar15;
  float f;
  Key local_58;
  
  p_Var3 = (dad->children).
           super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  if (p_Var3 == (_List_node_base *)&dad->children) {
    pLVar9 = DefaultLogger::get();
    Logger::error(pLVar9,"LWS: Envelope descriptions must not be empty");
    return;
  }
  p_Var7 = p_Var3[3]._M_next;
  puVar12 = (uint *)(ulong)*(byte *)&p_Var7->_M_next;
  uVar14 = 0;
  if (0xf5 < (byte)(*(byte *)&p_Var7->_M_next - 0x3a)) {
    do {
      p_Var7 = (_List_node_base *)((long)&p_Var7->_M_next + 1);
      uVar13 = (uint)(byte)((char)puVar12 - 0x30) + (int)uVar14 * 10;
      uVar14 = (ulong)uVar13;
      puVar12 = (uint *)(ulong)*(byte *)&p_Var7->_M_next;
    } while (0xf5 < (byte)(*(byte *)&p_Var7->_M_next - 0x3a));
    uVar14 = (ulong)uVar13;
  }
  std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::reserve(&fill->keys,uVar14);
  p_Var3 = p_Var3->_M_next;
  do {
    if (p_Var3 == (_List_node_base *)&dad->children) {
      return;
    }
    pAVar15 = (Assimp *)p_Var3[3]._M_next;
    iVar6 = std::__cxx11::string::compare((char *)(p_Var3 + 1));
    check_comma = SUB81(puVar12,0);
    if (iVar6 != 0) {
      iVar6 = std::__cxx11::string::compare((char *)(p_Var3 + 1));
      if (iVar6 == 0) {
        for (; (AVar2 = *pAVar15, AVar2 == (Assimp)0x20 || (AVar2 == (Assimp)0x9));
            pAVar15 = pAVar15 + 1) {
        }
        PVar10 = PrePostBehaviour_Reset;
        if (0xf5 < (byte)((char)AVar2 - 0x3aU)) {
          PVar10 = PrePostBehaviour_Reset;
          do {
            PVar10 = (uint)(byte)((char)AVar2 - 0x30) + PVar10 * 10;
            AVar2 = pAVar15[1];
            pAVar15 = pAVar15 + 1;
          } while (0xf5 < (byte)((char)AVar2 - 0x3aU));
        }
        fill->pre = PVar10;
        pAVar8 = pAVar15;
        while( true ) {
          pAVar8 = pAVar8 + 1;
          AVar2 = *pAVar15;
          puVar12 = (uint *)(ulong)(byte)AVar2;
          if ((AVar2 != (Assimp)0x20) && (AVar2 != (Assimp)0x9)) break;
          pAVar15 = pAVar15 + 1;
        }
        PVar10 = PrePostBehaviour_Reset;
        if (0xf5 < (byte)((char)AVar2 - 0x3aU)) {
          PVar10 = PrePostBehaviour_Reset;
          do {
            PVar10 = (uint)(byte)((char)puVar12 - 0x30) + PVar10 * 10;
            AVar2 = *pAVar8;
            puVar12 = (uint *)(ulong)(byte)AVar2;
            pAVar8 = pAVar8 + 1;
          } while (0xf5 < (byte)((char)AVar2 - 0x3aU));
        }
        fill->post = PVar10;
      }
      goto LAB_0044ad4c;
    }
    local_58.time = 0.0;
    local_58.value = 0.0;
    local_58.inter = IT_LINE;
    local_58.params[0] = 0.0;
    local_58.params[1] = 0.0;
    local_58.params[2] = 0.0;
    local_58.params[3] = 0.0;
    local_58.params[4] = 0.0;
    __position._M_current =
         (fill->keys).super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (fill->keys).super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::
      _M_realloc_insert<Assimp::LWO::Key>(&fill->keys,__position,&local_58);
    }
    else {
      *(ulong *)((__position._M_current)->params + 4) = (ulong)(uint)local_58._36_4_ << 0x20;
      (__position._M_current)->params[0] = 0.0;
      (__position._M_current)->params[1] = 0.0;
      (__position._M_current)->params[2] = 0.0;
      (__position._M_current)->params[3] = 0.0;
      (__position._M_current)->time = 0.0;
      (__position._M_current)->value = 0.0;
      (__position._M_current)->inter = IT_LINE;
      ppKVar1 = &(fill->keys).
                 super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppKVar1 = *ppKVar1 + 1;
    }
    pKVar4 = (fill->keys).super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (; (*pAVar15 == (Assimp)0x20 || (*pAVar15 == (Assimp)0x9)); pAVar15 = pAVar15 + 1) {
    }
    for (pAVar15 = (Assimp *)
                   fast_atoreal_move<float>
                             (pAVar15,(char *)&pKVar4[-1].value,(float *)0x1,(bool)check_comma);
        (AVar2 = *pAVar15, AVar2 == (Assimp)0x20 || (AVar2 == (Assimp)0x9)); pAVar15 = pAVar15 + 1)
    {
    }
    pAVar15 = (Assimp *)fast_atoreal_move<float>(pAVar15,(char *)&local_58,(float *)0x1,(bool)AVar2)
    ;
    pKVar4[-1].time = (double)local_58.time._0_4_;
    puVar11 = (uint *)(ulong)(byte)*pAVar15;
    iVar6 = 0;
    if (0xf5 < (byte)((char)*pAVar15 - 0x3aU)) {
      iVar6 = 0;
      do {
        iVar6 = (uint)(byte)((char)puVar11 - 0x30) + iVar6 * 10;
        pAVar8 = pAVar15 + 1;
        puVar11 = (uint *)(ulong)(byte)*pAVar8;
        pAVar15 = pAVar15 + 1;
      } while (0xf5 < (byte)((char)*pAVar8 - 0x3aU));
    }
    puVar12 = &switchD_0044ac9c::switchdataD_0072e960;
    switch(iVar6) {
    case 0:
      pKVar4[-1].inter = IT_TCB;
      goto LAB_0044acba;
    case 1:
    case 2:
      pKVar4[-1].inter = IT_HERM;
LAB_0044acba:
      iVar6 = 5;
LAB_0044acd0:
      bVar5 = true;
      goto LAB_0044acf7;
    case 3:
      pKVar4[-1].inter = IT_LINE;
      break;
    case 4:
      pKVar4[-1].inter = IT_STEP;
      break;
    case 5:
      pKVar4[-1].inter = IT_BEZ2;
      iVar6 = 4;
      goto LAB_0044acd0;
    default:
      pLVar9 = DefaultLogger::get();
      Logger::error(pLVar9,"LWS: Unknown span type");
      puVar12 = puVar11;
    }
    bVar5 = false;
    iVar6 = 0;
LAB_0044acf7:
    if (bVar5) {
      uVar14 = 0;
      do {
        for (; (*pAVar15 == (Assimp)0x20 || (*pAVar15 == (Assimp)0x9)); pAVar15 = pAVar15 + 1) {
        }
        pAVar15 = (Assimp *)
                  fast_atoreal_move<float>
                            (pAVar15,(char *)(pKVar4->params + (uVar14 - 10)),(float *)0x1,
                             SUB81(puVar12,0));
        uVar14 = uVar14 + 1;
      } while (uVar14 != iVar6 + (uint)(iVar6 == 0));
    }
LAB_0044ad4c:
    p_Var3 = p_Var3->_M_next;
  } while( true );
}

Assistant:

void LWSImporter::ReadEnvelope(const LWS::Element& dad, LWO::Envelope& fill )
{
    if (dad.children.empty()) {
        ASSIMP_LOG_ERROR("LWS: Envelope descriptions must not be empty");
        return;
    }

    // reserve enough storage
    std::list< LWS::Element >::const_iterator it = dad.children.begin();;
    fill.keys.reserve(strtoul10(it->tokens[1].c_str()));

    for (++it; it != dad.children.end(); ++it) {
        const char* c = (*it).tokens[1].c_str();

        if ((*it).tokens[0] == "Key") {
            fill.keys.push_back(LWO::Key());
            LWO::Key& key = fill.keys.back();

            float f;
            SkipSpaces(&c);
            c = fast_atoreal_move<float>(c,key.value);
            SkipSpaces(&c);
            c = fast_atoreal_move<float>(c,f);

            key.time = f;

            unsigned int span = strtoul10(c,&c), num = 0;
            switch (span) {

                case 0:
                    key.inter = LWO::IT_TCB;
                    num = 5;
                    break;
                case 1:
                case 2:
                    key.inter = LWO::IT_HERM;
                    num = 5;
                    break;
                case 3:
                    key.inter = LWO::IT_LINE;
                    num = 0;
                    break;
                case 4:
                    key.inter = LWO::IT_STEP;
                    num = 0;
                    break;
                case 5:
                    key.inter = LWO::IT_BEZ2;
                    num = 4;
                    break;
                default:
                    ASSIMP_LOG_ERROR("LWS: Unknown span type");
            }
            for (unsigned int i = 0; i < num;++i) {
                SkipSpaces(&c);
                c = fast_atoreal_move<float>(c,key.params[i]);
            }
        }
        else if ((*it).tokens[0] == "Behaviors") {
            SkipSpaces(&c);
            fill.pre = (LWO::PrePostBehaviour) strtoul10(c,&c);
            SkipSpaces(&c);
            fill.post = (LWO::PrePostBehaviour) strtoul10(c,&c);
        }
    }
}